

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecutorTests.cpp
# Opt level: O1

void __thiscall
ExecutorTest_ExitCodeWorks_Test::~ExecutorTest_ExitCodeWorks_Test
          (ExecutorTest_ExitCodeWorks_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExecutorTest, ExitCodeWorks)
{
  std::string source = R"SRC(
  fn main(): f32
  {
    ret 12;
  }
  )SRC";

  std::string expected = "";

  testProgram(source, expected, 12);
}